

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * jsonBadPathError(sqlite3_context *ctx,char *zPath)

{
  char *z;
  char *extraout_RAX;
  char *extraout_RAX_00;
  
  z = sqlite3_mprintf("bad JSON path: %Q");
  if (ctx == (sqlite3_context *)0x0) {
    return z;
  }
  if (z != (char *)0x0) {
    ctx->isError = 1;
    sqlite3VdbeMemSetStr(ctx->pOut,z,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3_free(z);
    return extraout_RAX;
  }
  sqlite3_result_error_nomem(ctx);
  return extraout_RAX_00;
}

Assistant:

static char *jsonBadPathError(
  sqlite3_context *ctx,     /* The function call containing the error */
  const char *zPath         /* The path with the problem */
){
  char *zMsg = sqlite3_mprintf("bad JSON path: %Q", zPath);
  if( ctx==0 ) return zMsg;
  if( zMsg ){
    sqlite3_result_error(ctx, zMsg, -1);
    sqlite3_free(zMsg);
  }else{
    sqlite3_result_error_nomem(ctx);
  }
  return 0;
}